

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_deserializer.cpp
# Opt level: O1

void __thiscall
miniros::MessageDeserializer::MessageDeserializer
          (MessageDeserializer *this,SubscriptionCallbackHelperPtr *helper,SerializedMessage *m,
          shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          *connection_header)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  type_info *ptVar2;
  char *__s1;
  char *__s2;
  uint8_t *puVar3;
  int iVar4;
  undefined4 extraout_var;
  
  (this->helper_).
  super___shared_ptr<miniros::SubscriptionCallbackHelper,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (helper->super___shared_ptr<miniros::SubscriptionCallbackHelper,_(__gnu_cxx::_Lock_policy)2>)
       ._M_ptr;
  p_Var1 = (helper->
           super___shared_ptr<miniros::SubscriptionCallbackHelper,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (this->helper_).
  super___shared_ptr<miniros::SubscriptionCallbackHelper,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  (this->serialized_message_).buf.super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (m->buf).super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var1 = (m->buf).super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (this->serialized_message_).buf.super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  puVar3 = m->message_start;
  (this->serialized_message_).num_bytes = m->num_bytes;
  (this->serialized_message_).message_start = puVar3;
  (this->serialized_message_).message.super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (m->message).super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var1 = (m->message).super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  (this->serialized_message_).message.super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  (this->serialized_message_).type_info = m->type_info;
  (this->connection_header_).
  super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (connection_header->
            super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
            )._M_ptr;
  p_Var1 = (connection_header->
           super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
           )._M_refcount._M_pi;
  (this->connection_header_).
  super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  (this->mutex_).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  (this->msg_).super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  *(undefined8 *)((long)&(this->mutex_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->mutex_).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->mutex_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->mutex_).super___mutex_base._M_mutex + 8) = 0;
  (this->msg_).super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if ((this->serialized_message_).message.super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr != (element_type *)0x0) {
    ptVar2 = (this->serialized_message_).type_info;
    iVar4 = (*((helper->
               super___shared_ptr<miniros::SubscriptionCallbackHelper,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr)->_vptr_SubscriptionCallbackHelper[4])();
    __s1 = *(char **)(ptVar2 + 8);
    __s2 = *(char **)(CONCAT44(extraout_var,iVar4) + 8);
    if (__s1 != __s2) {
      if ((*__s1 != '*') && (iVar4 = strcmp(__s1,__s2), iVar4 == 0)) {
        return;
      }
      p_Var1 = (this->serialized_message_).message.
               super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      (this->serialized_message_).message.super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      (this->serialized_message_).message.super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
        return;
      }
    }
  }
  return;
}

Assistant:

MessageDeserializer::MessageDeserializer(const SubscriptionCallbackHelperPtr& helper, const SerializedMessage& m, const std::shared_ptr<M_string>& connection_header)
: helper_(helper)
, serialized_message_(m)
, connection_header_(connection_header)
{
  if (serialized_message_.message && *serialized_message_.type_info != helper->getTypeInfo())
  {
    serialized_message_.message.reset();
  }
}